

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O3

void __thiscall xray_re::xr_guid::load(xr_guid *this,xr_reader *r)

{
  uint32_t *puVar1;
  
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->g[0] = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->g[1] = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->g[2] = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->g[3] = *puVar1;
  return;
}

Assistant:

inline uint32_t xr_reader::r_u32() { return *m_p_u32++; }